

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiver.cpp
# Opt level: O1

void __thiscall MyClientConnection::OnConnect(MyClientConnection *this)

{
  ostringstream *this_00;
  size_t sVar1;
  OutputWorker *this_01;
  TonkStatusEx status;
  TonkStatusEx TStack_218;
  undefined1 local_198 [392];
  
  tonk::SDKConnection::GetStatusEx(&TStack_218,&this->super_SDKConnection);
  if ((int)Logger.ChannelMinLevel < 3) {
    this_00 = (ostringstream *)(local_198 + 0x10);
    local_198._0_8_ = Logger.ChannelName;
    local_198._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Connected to ",0xd);
    sVar1 = strlen(TStack_218.Remote.NetworkString);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,TStack_218.Remote.NetworkString,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," : ",3);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    this_01 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_198);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  return;
}

Assistant:

void MyClientConnection::OnConnect()
{
    auto status = GetStatusEx();

    Logger.Info("Connected to ", status.Remote.NetworkString, " : ", status.Remote.UDPPort);
}